

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O2

ProString * __thiscall
ProString::operator+=
          (ProString *this,
          QStringBuilder<QStringBuilder<ProString_&,_QString_&>,_ProString_&> *other)

{
  ProString *pPVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QStringBuilder<QStringBuilder<ProString_&,_QString_&>,_ProString_&>::convertTo<QString>
            ((QString *)&local_30,other);
  pPVar1 = append(this,(QString *)&local_30);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return pPVar1;
  }
  __stack_chk_fail();
}

Assistant:

ProString &operator+=(const QStringBuilder<A, B> &other) { return append(QString(other)); }